

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdoc.c
# Opt level: O2

void prvTidyCleanGoogleDocument(TidyDocImpl *doc)

{
  Node *pNVar1;
  Node *pNVar2;
  Node *pNVar3;
  Bool BVar4;
  TidyTagId TVar5;
  Stack *stack;
  Node *pNVar6;
  AttVal *pAVar7;
  Node *pNVar8;
  Node **ppNVar9;
  
  stack = prvTidynewStack(doc,0x10);
  pNVar8 = (doc->root).content;
  if (pNVar8 != (Node *)0x0) {
    while (pNVar8 != (Node *)0x0) {
      pNVar6 = pNVar8->next;
      BVar4 = prvTidynodeIsElement(pNVar8);
      if (BVar4 == no) goto LAB_00150d50;
      if (pNVar8->tag == (Dict *)0x0) {
LAB_00150c9e:
        if (pNVar8->attributes != (AttVal *)0x0) {
          prvTidyDropAttrByName(doc,pNVar8,"class");
        }
        prvTidypush(stack,pNVar6);
        pNVar8 = pNVar8->content;
      }
      else {
        TVar5 = pNVar8->tag->id;
        if (TVar5 == TidyTag_STYLE) {
          prvTidyDiscardElement(doc,pNVar8);
          if (pNVar8->tag == (Dict *)0x0) goto LAB_00150c9e;
          TVar5 = pNVar8->tag->id;
        }
        if (TVar5 == TidyTag_A) {
          if (pNVar8->content == (Node *)0x0) {
            pAVar7 = prvTidyGetAttrByName(pNVar8,"name");
            if ((pAVar7 != (AttVal *)0x0) ||
               (pAVar7 = prvTidyGetAttrByName(pNVar8,anon_var_dwarf_5271a + 0x2b),
               pAVar7 != (AttVal *)0x0)) {
              prvTidyRepairAttrValue(doc,pNVar8->parent,anon_var_dwarf_5271a + 0x2b,pAVar7->value);
            }
LAB_00150d0e:
            prvTidyDiscardElement(doc,pNVar8);
            goto LAB_00150d50;
          }
          goto LAB_00150c9e;
        }
        if (TVar5 != TidyTag_SPAN) {
          if ((TVar5 == TidyTag_P) && (pNVar8->content == (Node *)0x0)) goto LAB_00150d0e;
          goto LAB_00150c9e;
        }
        pNVar6 = pNVar8->content;
        if (pNVar6 == (Node *)0x0) {
          pNVar6 = prvTidyDiscardElement(doc,pNVar8);
        }
        else {
          pNVar1 = pNVar8->parent;
          pNVar2 = pNVar8->next;
          pNVar3 = pNVar8->last;
          ppNVar9 = &pNVar2->prev;
          if (pNVar2 == (Node *)0x0) {
            ppNVar9 = &pNVar1->last;
          }
          pNVar3->next = pNVar2;
          *ppNVar9 = pNVar3;
          if (pNVar8->prev == (Node *)0x0) {
            ppNVar9 = &pNVar1->content;
          }
          else {
            pNVar6->prev = pNVar8->prev;
            ppNVar9 = &pNVar8->prev->next;
          }
          *ppNVar9 = pNVar6;
          ppNVar9 = &pNVar8->content;
          while (pNVar6 = *ppNVar9, pNVar6 != (Node *)0x0) {
            pNVar6->parent = pNVar1;
            ppNVar9 = &pNVar6->next;
          }
          pNVar6 = pNVar8->content;
          pNVar8->next = (Node *)0x0;
          pNVar8->content = (Node *)0x0;
          prvTidyFreeNode(doc,pNVar8);
        }
LAB_00150d50:
        pNVar8 = pNVar6;
        if (pNVar8 == (Node *)0x0) {
          pNVar8 = prvTidypop(stack);
        }
      }
    }
    prvTidyfreeStack(stack);
  }
  pNVar8 = prvTidyFindHEAD(doc);
  if (pNVar8 == (Node *)0x0) {
    return;
  }
  pNVar6 = prvTidyInferredTag(doc,TidyTag_META);
  prvTidyAddAttribute(doc,pNVar6,"http-equiv","Content-Type");
  prvTidyAddAttribute(doc,pNVar6,"content","text/html; charset=UTF-8");
  prvTidyInsertNodeAtStart(pNVar8,pNVar6);
  return;
}

Assistant:

void TY_(CleanGoogleDocument)( TidyDocImpl* doc )
{
    /* placeholder.  CleanTree()/CleanNode() will not
    ** zap root element 
    */
    CleanNode( doc, &doc->root );
    SetUTF8( doc );
}